

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

alik_css_object alik_css_init(int p,int d,int q,int N)

{
  int iVar1;
  alik_css_object paVar2;
  double dVar3;
  int local_24;
  int t;
  int i;
  alik_css_object obj;
  int N_local;
  int q_local;
  int d_local;
  int p_local;
  
  if ((p < 0x65) && (q < 0x65)) {
    paVar2 = (alik_css_object)malloc((long)N * 0x18 + 0x688);
    paVar2->p = p;
    paVar2->d = d;
    paVar2->q = q;
    paVar2->N = N;
    paVar2->length = N;
    paVar2->pq = p + q;
    paVar2->M = 0;
    if (d == 0) {
      paVar2->pq = paVar2->pq + 1;
      paVar2->M = 1;
    }
    paVar2->r = p;
    if (paVar2->r < q + 1) {
      paVar2->r = q + 1;
    }
    iVar1 = paVar2->r;
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      paVar2->phi[local_24] = 0.0;
    }
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      paVar2->theta[local_24] = 0.0;
    }
    dVar3 = macheps();
    paVar2->eps = dVar3;
    paVar2->mean = 0.0;
    return paVar2;
  }
  printf("\n p and q should be less than 100. \n");
  printf("Use sarima_init if either p > 100 or q > 100 \n");
  exit(1);
}

Assistant:

alik_css_object alik_css_init(int p, int d, int q, int N) {
	alik_css_object obj = NULL;
	int i, t;
	if (p > 100 || q > 100) {
		printf("\n p and q should be less than 100. \n");
		printf("Use sarima_init if either p > 100 or q > 100 \n");
		exit(1);
	}

	obj = (alik_css_object)malloc(sizeof(struct alik_css_set) + sizeof(double)* 3 * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->length = N;
	obj->pq = p + q;
	obj->M = 0;

	if (d == 0) {
		obj->pq = obj->pq + 1;
		obj->M = 1;
	}

	obj->r = p;

	t = 1 + q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	for (i = 0; i < t; ++i) {
		obj->phi[i] = 0.0;
	}

	for (i = 0; i < t; ++i) {
		obj->theta[i] = 0.0;
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}